

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

int __thiscall
cmCTestCoverageHandler::RunBullseyeSourceSummary
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  cmCTest *pcVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  ostream *poVar9;
  long lVar10;
  undefined4 uVar11;
  string file;
  string local_828;
  ostream *local_808;
  int local_800;
  int functionsCalled;
  int branchCovered;
  float local_7f4;
  string shortFileName;
  float cper;
  int percentBranch;
  int totalBranches;
  int percentFunction;
  int totalFunctions;
  double total_functions;
  double total_untested;
  double total_tested;
  float local_79c;
  cmXMLWriter xml;
  string sourceFile;
  string stdline;
  string outputFile;
  undefined1 local_6d8 [16];
  double local_6c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  coveredFilesFullPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  coveredFiles;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  coveredFileNames;
  string errline;
  string coverage_start_time;
  string end_time;
  ios_base local_588 [264];
  ifstream fin;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  byte abStack_460 [80];
  ios_base local_410 [408];
  cmGeneratedFileStream covSumFile;
  
  outputFile._M_dataplus._M_p = (pointer)&outputFile.field_2;
  outputFile._M_string_length = 0;
  outputFile.field_2._M_local_buf[0] = '\0';
  iVar7 = RunBullseyeCommand(this,cont,"covsrc","-c",&outputFile);
  if (iVar7 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&covSumFile);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&covSumFile,"error running covsrc:\n",0x16);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x7bc,_fin,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_fin != &local_470) {
      operator_delete(_fin,local_470._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&covSumFile);
    std::ios_base::~ios_base
              ((ios_base *)
               &covSumFile.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                field_0x70);
    iVar7 = 0;
  }
  else {
    local_808 = cont->OFS;
    cmGeneratedFileStream::cmGeneratedFileStream(&covSumFile,None);
    cmXMLWriter::cmXMLWriter(&xml,(ostream *)&covSumFile,0);
    bVar6 = cmCTestGenericHandler::StartResultingXML
                      (&this->super_cmCTestGenericHandler,PartCoverage,"Coverage",&covSumFile);
    if (bVar6) {
      cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,&xml,
                        (this->super_cmCTestGenericHandler).AppendXML);
      lVar8 = std::chrono::_V2::steady_clock::now();
      cmCTest::CurrentTime_abi_cxx11_
                (&coverage_start_time,(this->super_cmCTestGenericHandler).CTest);
      _fin = (pointer)&local_470;
      std::__cxx11::string::_M_construct<char_const*>((string *)&fin,"Coverage","");
      cmXMLWriter::StartElement(&xml,(string *)&fin);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_fin != &local_470) {
        operator_delete(_fin,local_470._M_allocated_capacity + 1);
      }
      _fin = (pointer)&local_470;
      std::__cxx11::string::_M_construct<char_const*>((string *)&fin,"StartDateTime","");
      cmXMLWriter::StartElement(&xml,(string *)&fin);
      cmXMLWriter::Content<std::__cxx11::string>(&xml,&coverage_start_time);
      cmXMLWriter::EndElement(&xml);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_fin != &local_470) {
        operator_delete(_fin,local_470._M_allocated_capacity + 1);
      }
      _fin = (pointer)&local_470;
      std::__cxx11::string::_M_construct<char_const*>((string *)&fin,"StartTime","");
      end_time._M_dataplus._M_p = (pointer)std::chrono::_V2::system_clock::now();
      cmXMLWriter::
      Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                (&xml,(string *)&fin,
                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)&end_time);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_fin != &local_470) {
        operator_delete(_fin,local_470._M_allocated_capacity + 1);
      }
      stdline._M_dataplus._M_p = (pointer)&stdline.field_2;
      stdline._M_string_length = 0;
      stdline.field_2._M_local_buf[0] = '\0';
      errline._M_dataplus._M_p = (pointer)&errline.field_2;
      errline._M_string_length = 0;
      errline.field_2._M_local_buf[0] = '\0';
      sourceFile._M_dataplus._M_p = (pointer)&sourceFile.field_2;
      sourceFile._M_string_length = 0;
      sourceFile.field_2._M_local_buf[0] = '\0';
      functionsCalled = 0;
      totalFunctions = 0;
      percentFunction = 0;
      branchCovered = 0;
      totalBranches = 0;
      percentBranch = 0;
      total_tested = 0.0;
      total_untested = 0.0;
      total_functions = 0.0;
      coveredFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      coveredFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      coveredFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      coveredFilesFullPath.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      coveredFilesFullPath.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      coveredFilesFullPath.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::ifstream::ifstream(&fin,outputFile._M_dataplus._M_p,_S_in);
      if ((abStack_460[*(long *)(_fin + -0x18)] & 5) == 0) {
        coveredFileNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &coveredFileNames._M_t._M_impl.super__Rb_tree_header._M_header;
        coveredFileNames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        coveredFileNames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        coveredFileNames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_6d8 = ZEXT816(0);
        local_6c8 = 0.0;
        coveredFileNames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             coveredFileNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while( true ) {
          bVar6 = cmsys::SystemTools::GetLineFromStream((istream *)&fin,&stdline,(bool *)0x0,-1);
          if (!bVar6) break;
          if (stdline._M_string_length != 0) {
            ParseBullsEyeCovsrcLine
                      (this,&stdline,&sourceFile,&functionsCalled,&totalFunctions,&percentFunction,
                       &branchCovered,&totalBranches,&percentBranch);
            iVar7 = std::__cxx11::string::compare((char *)&sourceFile);
            if (iVar7 != 0) {
              iVar7 = std::__cxx11::string::compare((char *)&sourceFile);
              if (iVar7 != 0) {
                file._M_dataplus._M_p = (pointer)&file.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&file,sourceFile._M_dataplus._M_p,
                           sourceFile._M_dataplus._M_p + sourceFile._M_string_length);
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&coveredFileNames,&file);
                bVar6 = cmsys::SystemTools::FileIsFullPath(&sourceFile);
                if (!bVar6) {
                  std::__cxx11::string::_M_assign((string *)&file);
                  std::__cxx11::string::append((char *)&file);
                  std::__cxx11::string::_M_append((char *)&file,(ulong)sourceFile._M_dataplus._M_p);
                }
                cmsys::SystemTools::CollapseFullPath(&end_time,&file);
                std::__cxx11::string::operator=((string *)&file,(string *)&end_time);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)end_time._M_dataplus._M_p != &end_time.field_2) {
                  operator_delete(end_time._M_dataplus._M_p,
                                  end_time.field_2._M_allocated_capacity + 1);
                }
                bVar6 = ShouldIDoCoverage(this,&file,&cont->SourceDir,&cont->BinaryDir);
                if (bVar6) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&end_time);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&end_time,"Doing coverage for: ",0x14);
                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&end_time,file._M_dataplus._M_p,
                                      file._M_string_length);
                  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
                  std::ostream::put((char)poVar9);
                  std::ostream::flush();
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar1,5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x80e,shortFileName._M_dataplus._M_p,
                               (this->super_cmCTestGenericHandler).Quiet);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)shortFileName._M_dataplus._M_p != &shortFileName.field_2) {
                    operator_delete(shortFileName._M_dataplus._M_p,
                                    shortFileName.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&end_time);
                  std::ios_base::~ios_base(local_588);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&coveredFiles,&sourceFile);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&coveredFilesFullPath,&file);
                  iVar5 = totalFunctions;
                  total_functions = (double)totalFunctions + total_functions;
                  total_tested = (double)functionsCalled + total_tested;
                  local_6c8 = local_6c8 + 1.0;
                  total_untested = (double)(totalFunctions - functionsCalled) + total_untested;
                  cmsys::SystemTools::GetFilenameName(&end_time,&file);
                  cmCTest::GetShortPathToFile_abi_cxx11_
                            (&shortFileName,(this->super_cmCTestGenericHandler).CTest,
                             file._M_dataplus._M_p);
                  iVar4 = percentFunction;
                  iVar3 = totalBranches;
                  iVar7 = percentBranch;
                  cper = (float)(percentFunction + percentBranch);
                  if (0 < totalBranches) {
                    cper = cper * 0.5;
                  }
                  local_7f4 = cper / 100.0;
                  local_79c = cper;
                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                     (local_808,stdline._M_dataplus._M_p,stdline._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                     (local_808,end_time._M_dataplus._M_p,end_time._M_string_length)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_808,"functionsCalled: ",0x11);
                  poVar9 = (ostream *)std::ostream::operator<<(local_808,functionsCalled / 100);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_808,"totalFunctions: ",0x10);
                  poVar9 = (ostream *)std::ostream::operator<<(local_808,iVar5 / 100);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_808,"percentFunction: ",0x11);
                  poVar9 = (ostream *)std::ostream::operator<<(local_808,iVar4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_808,"branchCovered: ",0xf);
                  poVar9 = (ostream *)std::ostream::operator<<(local_808,branchCovered);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_808,"totalBranches: ",0xf);
                  poVar9 = (ostream *)std::ostream::operator<<(local_808,iVar3);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_808,"percentBranch: ",0xf);
                  poVar9 = (ostream *)std::ostream::operator<<(local_808,iVar7);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_808,"percentCoverage: ",0x11);
                  uVar11 = local_6d8._12_4_;
                  dVar2 = local_6d8._0_8_ + (double)local_79c;
                  local_6d8._8_4_ = local_6d8._8_4_;
                  local_6d8._0_8_ = dVar2;
                  local_6d8._12_4_ = uVar11;
                  poVar9 = std::ostream::_M_insert<double>(dVar2);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_808,"coverage metric: ",0x11);
                  poVar9 = std::ostream::_M_insert<double>((double)local_7f4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"File","");
                  cmXMLWriter::StartElement(&xml,&local_828);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_828._M_dataplus._M_p != &local_828.field_2) {
                    operator_delete(local_828._M_dataplus._M_p,
                                    local_828.field_2._M_allocated_capacity + 1);
                  }
                  cmXMLWriter::Attribute<std::__cxx11::string>(&xml,"Name",&sourceFile);
                  cmXMLWriter::Attribute<std::__cxx11::string>(&xml,"FullPath",&shortFileName);
                  local_828._M_dataplus._M_p = "false";
                  if (0.0 < local_7f4) {
                    local_828._M_dataplus._M_p = "true";
                  }
                  cmXMLWriter::Attribute<char_const*>(&xml,"Covered",(char **)&local_828);
                  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_828,"BranchesTested","");
                  cmXMLWriter::Element<int>(&xml,&local_828,&branchCovered);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_828._M_dataplus._M_p != &local_828.field_2) {
                    operator_delete(local_828._M_dataplus._M_p,
                                    local_828.field_2._M_allocated_capacity + 1);
                  }
                  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_828,"BranchesUnTested","");
                  local_800 = iVar3 - branchCovered;
                  cmXMLWriter::Element<int>(&xml,&local_828,&local_800);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_828._M_dataplus._M_p != &local_828.field_2) {
                    operator_delete(local_828._M_dataplus._M_p,
                                    local_828.field_2._M_allocated_capacity + 1);
                  }
                  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_828,"FunctionsTested","");
                  cmXMLWriter::Element<int>(&xml,&local_828,&functionsCalled);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_828._M_dataplus._M_p != &local_828.field_2) {
                    operator_delete(local_828._M_dataplus._M_p,
                                    local_828.field_2._M_allocated_capacity + 1);
                  }
                  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_828,"FunctionsUnTested","");
                  local_800 = iVar5 - functionsCalled;
                  cmXMLWriter::Element<int>(&xml,&local_828,&local_800);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_828._M_dataplus._M_p != &local_828.field_2) {
                    operator_delete(local_828._M_dataplus._M_p,
                                    local_828.field_2._M_allocated_capacity + 1);
                  }
                  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_828,"LOCTested","");
                  local_800 = functionsCalled * 100;
                  cmXMLWriter::Element<int>(&xml,&local_828,&local_800);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_828._M_dataplus._M_p != &local_828.field_2) {
                    operator_delete(local_828._M_dataplus._M_p,
                                    local_828.field_2._M_allocated_capacity + 1);
                  }
                  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_828,"LOCUnTested","");
                  local_800 = (iVar5 - functionsCalled) * 100;
                  cmXMLWriter::Element<int>(&xml,&local_828,&local_800);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_828._M_dataplus._M_p != &local_828.field_2) {
                    operator_delete(local_828._M_dataplus._M_p,
                                    local_828.field_2._M_allocated_capacity + 1);
                  }
                  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_828,"PercentCoverage","");
                  cmXMLWriter::Element<float>(&xml,&local_828,&cper);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_828._M_dataplus._M_p != &local_828.field_2) {
                    operator_delete(local_828._M_dataplus._M_p,
                                    local_828.field_2._M_allocated_capacity + 1);
                  }
                  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_828,"CoverageMetric","");
                  cmXMLWriter::Element<float>(&xml,&local_828,&local_7f4);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_828._M_dataplus._M_p != &local_828.field_2) {
                    operator_delete(local_828._M_dataplus._M_p,
                                    local_828.field_2._M_allocated_capacity + 1);
                  }
                  WriteXMLLabels(this,&xml,&shortFileName);
                  cmXMLWriter::EndElement(&xml);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)shortFileName._M_dataplus._M_p != &shortFileName.field_2) {
                    operator_delete(shortFileName._M_dataplus._M_p,
                                    shortFileName.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)end_time._M_dataplus._M_p != &end_time.field_2) {
                    operator_delete(end_time._M_dataplus._M_p,
                                    end_time.field_2._M_allocated_capacity + 1);
                  }
                }
                else {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&end_time);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&end_time,
                             ".NoDartCoverage found, so skip coverage check for: ",0x33);
                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&end_time,file._M_dataplus._M_p,
                                      file._M_string_length);
                  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
                  std::ostream::put((char)poVar9);
                  std::ostream::flush();
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar1,5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x808,shortFileName._M_dataplus._M_p,
                               (this->super_cmCTestGenericHandler).Quiet);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)shortFileName._M_dataplus._M_p != &shortFileName.field_2) {
                    operator_delete(shortFileName._M_dataplus._M_p,
                                    shortFileName.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&end_time);
                  std::ios_base::~ios_base(local_588);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)file._M_dataplus._M_p != &file.field_2) {
                  operator_delete(file._M_dataplus._M_p,file.field_2._M_allocated_capacity + 1);
                }
              }
            }
          }
        }
        cmCTest::CurrentTime_abi_cxx11_(&end_time,(this->super_cmCTestGenericHandler).CTest);
        file._M_dataplus._M_p = (pointer)&file.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&file,"LOCTested","");
        cmXMLWriter::Element<double>(&xml,&file,&total_tested);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)file._M_dataplus._M_p != &file.field_2) {
          operator_delete(file._M_dataplus._M_p,file.field_2._M_allocated_capacity + 1);
        }
        file._M_dataplus._M_p = (pointer)&file.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&file,"LOCUntested","");
        cmXMLWriter::Element<double>(&xml,&file,&total_untested);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)file._M_dataplus._M_p != &file.field_2) {
          operator_delete(file._M_dataplus._M_p,file.field_2._M_allocated_capacity + 1);
        }
        file._M_dataplus._M_p = (pointer)&file.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&file,"LOC","");
        cmXMLWriter::Element<double>(&xml,&file,&total_functions);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)file._M_dataplus._M_p != &file.field_2) {
          operator_delete(file._M_dataplus._M_p,file.field_2._M_allocated_capacity + 1);
        }
        file._M_dataplus._M_p = (pointer)&file.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&file,"PercentCoverage","");
        shortFileName._M_dataplus._M_p =
             (pointer)(-(ulong)(local_6c8 != 0.0) & (ulong)(local_6d8._0_8_ / local_6c8));
        cmXMLWriter::Element<double>(&xml,&file,(double *)&shortFileName);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)file._M_dataplus._M_p != &file.field_2) {
          operator_delete(file._M_dataplus._M_p,file.field_2._M_allocated_capacity + 1);
        }
        file._M_dataplus._M_p = (pointer)&file.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&file,"EndDateTime","");
        cmXMLWriter::StartElement(&xml,&file);
        cmXMLWriter::Content<std::__cxx11::string>(&xml,&end_time);
        cmXMLWriter::EndElement(&xml);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)file._M_dataplus._M_p != &file.field_2) {
          operator_delete(file._M_dataplus._M_p,file.field_2._M_allocated_capacity + 1);
        }
        file._M_dataplus._M_p = (pointer)&file.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&file,"EndTime","");
        shortFileName._M_dataplus._M_p = (pointer)std::chrono::_V2::system_clock::now();
        cmXMLWriter::
        Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                  (&xml,&file,
                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)&shortFileName);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)file._M_dataplus._M_p != &file.field_2) {
          operator_delete(file._M_dataplus._M_p,file.field_2._M_allocated_capacity + 1);
        }
        file._M_dataplus._M_p = (pointer)&file.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&file,"ElapsedMinutes","");
        lVar10 = std::chrono::_V2::steady_clock::now();
        shortFileName._M_dataplus._M_p = (pointer)((lVar10 - lVar8) / 60000000000);
        cmXMLWriter::Element<long>(&xml,&file,(long *)&shortFileName);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)file._M_dataplus._M_p != &file.field_2) {
          operator_delete(file._M_dataplus._M_p,file.field_2._M_allocated_capacity + 1);
        }
        cmXMLWriter::EndElement(&xml);
        cmCTest::EndXML((this->super_cmCTestGenericHandler).CTest,&xml);
        iVar7 = RunBullseyeCoverageBranch
                          (this,cont,&coveredFileNames,&coveredFiles,&coveredFilesFullPath);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)end_time._M_dataplus._M_p != &end_time.field_2) {
          operator_delete(end_time._M_dataplus._M_p,end_time.field_2._M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&coveredFileNames._M_t);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&end_time);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&end_time,"Cannot open coverage summary file: ",0x23);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&end_time,outputFile._M_dataplus._M_p,
                            outputFile._M_string_length);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x7e9,(char *)coveredFileNames._M_t._M_impl._0_8_,false);
        if ((_Base_ptr *)coveredFileNames._M_t._M_impl._0_8_ !=
            &coveredFileNames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)coveredFileNames._M_t._M_impl._0_8_,
                          (ulong)((long)&(coveredFileNames._M_t._M_impl.super__Rb_tree_header.
                                          _M_header._M_parent)->_M_color + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&end_time);
        std::ios_base::~ios_base(local_588);
        iVar7 = 0;
      }
      std::ifstream::~ifstream(&fin);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&coveredFilesFullPath);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&coveredFiles);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceFile._M_dataplus._M_p != &sourceFile.field_2) {
        operator_delete(sourceFile._M_dataplus._M_p,
                        CONCAT71(sourceFile.field_2._M_allocated_capacity._1_7_,
                                 sourceFile.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)errline._M_dataplus._M_p != &errline.field_2) {
        operator_delete(errline._M_dataplus._M_p,
                        CONCAT71(errline.field_2._M_allocated_capacity._1_7_,
                                 errline.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)stdline._M_dataplus._M_p != &stdline.field_2) {
        operator_delete(stdline._M_dataplus._M_p,
                        CONCAT71(stdline.field_2._M_allocated_capacity._1_7_,
                                 stdline.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)coverage_start_time._M_dataplus._M_p != &coverage_start_time.field_2) {
        operator_delete(coverage_start_time._M_dataplus._M_p,
                        coverage_start_time.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fin,"Cannot open coverage summary file.",0x22);
      std::ios::widen((char)&fin + (char)*(undefined8 *)(_fin + -0x18));
      std::ostream::put((char)&fin);
      std::ostream::flush();
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x7c7,end_time._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)end_time._M_dataplus._M_p != &end_time.field_2) {
        operator_delete(end_time._M_dataplus._M_p,end_time.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fin);
      std::ios_base::~ios_base(local_410);
      iVar7 = 0;
    }
    cmXMLWriter::~cmXMLWriter(&xml);
    cmGeneratedFileStream::~cmGeneratedFileStream(&covSumFile);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputFile._M_dataplus._M_p != &outputFile.field_2) {
    operator_delete(outputFile._M_dataplus._M_p,
                    CONCAT71(outputFile.field_2._M_allocated_capacity._1_7_,
                             outputFile.field_2._M_local_buf[0]) + 1);
  }
  return iVar7;
}

Assistant:

int cmCTestCoverageHandler::RunBullseyeSourceSummary(
  cmCTestCoverageHandlerContainer* cont)
{
  // Run the covsrc command and create a temp outputfile
  std::string outputFile;
  if (!this->RunBullseyeCommand(cont, "covsrc", "-c", outputFile)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "error running covsrc:\n");
    return 0;
  }

  std::ostream& tmpLog = *cont->OFS;
  // copen the Coverage.xml file in the Testing directory
  cmGeneratedFileStream covSumFile;
  cmXMLWriter xml(covSumFile);
  if (!this->StartResultingXML(cmCTest::PartCoverage, "Coverage",
                               covSumFile)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot open coverage summary file." << std::endl);
    return 0;
  }
  this->CTest->StartXML(xml, this->AppendXML);
  auto elapsed_time_start = std::chrono::steady_clock::now();
  std::string coverage_start_time = this->CTest->CurrentTime();
  xml.StartElement("Coverage");
  xml.Element("StartDateTime", coverage_start_time);
  xml.Element("StartTime", std::chrono::system_clock::now());
  std::string stdline;
  std::string errline;
  // expected output:
  // first line is:
  // "Source","Function Coverage","out of","%","C/D Coverage","out of","%"
  // after that data follows in that format
  std::string sourceFile;
  int functionsCalled = 0;
  int totalFunctions = 0;
  int percentFunction = 0;
  int branchCovered = 0;
  int totalBranches = 0;
  int percentBranch = 0;
  double total_tested = 0;
  double total_untested = 0;
  double total_functions = 0;
  double percent_coverage = 0;
  double number_files = 0;
  std::vector<std::string> coveredFiles;
  std::vector<std::string> coveredFilesFullPath;
  // Read and parse the summary output file
  cmsys::ifstream fin(outputFile.c_str());
  if (!fin) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot open coverage summary file: " << outputFile
                                                     << std::endl);
    return 0;
  }
  std::set<std::string> coveredFileNames;
  while (cmSystemTools::GetLineFromStream(fin, stdline)) {
    // if we have a line of output from stdout
    if (!stdline.empty()) {
      // parse the comma separated output
      this->ParseBullsEyeCovsrcLine(
        stdline, sourceFile, functionsCalled, totalFunctions, percentFunction,
        branchCovered, totalBranches, percentBranch);
      // The first line is the header
      if (sourceFile == "Source" || sourceFile == "Total") {
        continue;
      }
      std::string file = sourceFile;
      coveredFileNames.insert(file);
      if (!cmSystemTools::FileIsFullPath(sourceFile)) {
        // file will be relative to the binary dir
        file = cont->BinaryDir;
        file += "/";
        file += sourceFile;
      }
      file = cmSystemTools::CollapseFullPath(file);
      bool shouldIDoCoverage =
        this->ShouldIDoCoverage(file, cont->SourceDir, cont->BinaryDir);
      if (!shouldIDoCoverage) {
        cmCTestOptionalLog(
          this->CTest, HANDLER_VERBOSE_OUTPUT,
          ".NoDartCoverage found, so skip coverage check for: " << file
                                                                << std::endl,
          this->Quiet);
        continue;
      }

      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Doing coverage for: " << file << std::endl,
                         this->Quiet);

      coveredFiles.push_back(sourceFile);
      coveredFilesFullPath.push_back(file);

      number_files++;
      total_functions += totalFunctions;
      total_tested += functionsCalled;
      total_untested += (totalFunctions - functionsCalled);

      std::string fileName = cmSystemTools::GetFilenameName(file);
      std::string shortFileName =
        this->CTest->GetShortPathToFile(file.c_str());

      float cper = static_cast<float>(percentBranch + percentFunction);
      if (totalBranches > 0) {
        cper /= 2.0f;
      }
      percent_coverage += static_cast<double>(cper);
      float cmet = static_cast<float>(percentFunction + percentBranch);
      if (totalBranches > 0) {
        cmet /= 2.0f;
      }
      cmet /= 100.0f;
      tmpLog << stdline << "\n";
      tmpLog << fileName << "\n";
      tmpLog << "functionsCalled: " << functionsCalled / 100 << "\n";
      tmpLog << "totalFunctions: " << totalFunctions / 100 << "\n";
      tmpLog << "percentFunction: " << percentFunction << "\n";
      tmpLog << "branchCovered: " << branchCovered << "\n";
      tmpLog << "totalBranches: " << totalBranches << "\n";
      tmpLog << "percentBranch: " << percentBranch << "\n";
      tmpLog << "percentCoverage: " << percent_coverage << "\n";
      tmpLog << "coverage metric: " << cmet << "\n";
      xml.StartElement("File");
      xml.Attribute("Name", sourceFile);
      xml.Attribute("FullPath", shortFileName);
      xml.Attribute("Covered", cmet > 0 ? "true" : "false");
      xml.Element("BranchesTested", branchCovered);
      xml.Element("BranchesUnTested", totalBranches - branchCovered);
      xml.Element("FunctionsTested", functionsCalled);
      xml.Element("FunctionsUnTested", totalFunctions - functionsCalled);
      // Hack for conversion of function to loc assume a function
      // has 100 lines of code
      xml.Element("LOCTested", functionsCalled * 100);
      xml.Element("LOCUnTested", (totalFunctions - functionsCalled) * 100);
      xml.Element("PercentCoverage", cper);
      xml.Element("CoverageMetric", cmet);
      this->WriteXMLLabels(xml, shortFileName);
      xml.EndElement(); // File
    }
  }
  std::string end_time = this->CTest->CurrentTime();
  xml.Element("LOCTested", total_tested);
  xml.Element("LOCUntested", total_untested);
  xml.Element("LOC", total_functions);
  xml.Element("PercentCoverage", SAFEDIV(percent_coverage, number_files));
  xml.Element("EndDateTime", end_time);
  xml.Element("EndTime", std::chrono::system_clock::now());
  xml.Element("ElapsedMinutes",
              std::chrono::duration_cast<std::chrono::minutes>(
                std::chrono::steady_clock::now() - elapsed_time_start)
                .count());
  xml.EndElement(); // Coverage
  this->CTest->EndXML(xml);

  // Now create the coverage information for each file
  return this->RunBullseyeCoverageBranch(cont, coveredFileNames, coveredFiles,
                                         coveredFilesFullPath);
}